

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnetfil.cpp
# Opt level: O2

void __thiscall ServerTicket::ServerTicket(ServerTicket *this,char *fname,int sfid)

{
  char *pcVar1;
  char hash1 [65];
  char acStack_78 [80];
  
  pcVar1 = TadsNetConfig::get(G_net_config_X,"serverid");
  sha256_ezf(acStack_78,"%s:%s",fname,pcVar1);
  pcVar1 = TadsNetConfig::get(G_net_config_X,"storage.apikey");
  sha256_ezf(this->ticket,"%s:%s",acStack_78,pcVar1);
  return;
}

Assistant:

ServerTicket(VMG_ const char *fname, int sfid)
    {
        /*
         *   The ticket formula is as follows:
         *   
         *.    hash1 = SHA256(fname : gameServerID)
         *.    ticket = SHA256(hash1 : apiKey)
         *   
         *   The filename must be the fully qualified filename with session
         *   ID prefix, of the form ~SID/path.
         *   
         *   The ticket's purpose is to authenticate the game server by
         *   proving that we know the API key, but without revealing the key.
         *   A secure hash accomplishes this by generating a hash value that
         *   can't be reversed (i.e., you can't figure the input given the
         *   output).  The double hash is for protection against chosen
         *   plaintext attacks - these aren't a known vulnerability in
         *   SHA256, but they've been used to attack older hash algorithms,
         *   so we've tried to minimize the impact should SHA256 eventually
         *   be found weaker in this area than presently thought.  The idea
         *   is that the filename is explicitly chosen by the user, and the
         *   session ID *could* be chosen by an attacker who only wants to
         *   get the server to generate hash codes for analysis (the storage
         *   server issues true session IDs, so an attacker can't choose SIDs
         *   that actually work against the server, but remember, the
         *   attacker's goal is to analyze the hash output to discover the
         *   secret API key).  The game server ID *can't* be chosen by the
         *   attacker, so we combine it with the two choosable plaintext
         *   elements to come up with the first hash.  The attacker *can't*
         *   choose the output of this hash, since SHA256 is considered
         *   secure against collision attacks (i.e., it's impossible to find
         *   SHA256 input that produces a chosen output).  The attacker will
         *   still *know* the plaintext that's hashed with the API key, but
         *   can't *choose* the plaintext.  
         */
        char hash1[65];
        sha256_ezf(hash1, "%s:%s",
                   fname, G_net_config->get("serverid"));
        sha256_ezf(ticket, "%s:%s",
                   hash1, G_net_config->get("storage.apikey"));
    }